

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FM.cpp
# Opt level: O0

uint FM_pass(Hypergraph *hypergraph,Partitionment *partitionment,uint max_diff)

{
  Move move_00;
  uint uVar1;
  ulong uVar2;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *this;
  size_type sVar3;
  type *move_01;
  type_conflict *ptVar4;
  GainedMove GVar5;
  type_conflict *gain;
  type *move;
  GainedMove local_b0;
  uint local_a4;
  uint local_a0;
  uint i;
  int cur_cost_reduction;
  undefined1 local_90 [8];
  GainContainer gain_container;
  Partitionment best_partitionment;
  uint best_cost_reduction;
  uint max_diff_local;
  Partitionment *partitionment_local;
  Hypergraph *hypergraph_local;
  
  best_partitionment.partitionment_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage._0_4_ = 0;
  Partitionment::Partitionment
            ((Partitionment *)
             &gain_container.num_cells_in_partitions_.
              super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,partitionment);
  GainContainer::GainContainer((GainContainer *)local_90,hypergraph,partitionment);
  local_a0 = 0;
  local_a4 = 0;
  while( true ) {
    uVar2 = (ulong)local_a4;
    this = Hypergraph::getCells(hypergraph);
    sVar3 = std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::size(this);
    if (sVar3 <= uVar2) break;
    GVar5 = GainContainer::getBestMove((GainContainer *)local_90,max_diff);
    local_b0 = GVar5;
    move_01 = std::get<0ul,Move,int>(&local_b0);
    ptVar4 = std::get<1ul,Move,int>(&local_b0);
    move_00.cell = move_01->cell;
    move_00.src = move_01->src;
    move_00.dst = move_01->dst;
    move_00._6_2_ = *(undefined2 *)&move_01->field_0x6;
    GainContainer::update((GainContainer *)local_90,hypergraph,partitionment,move_00);
    Partitionment::doMove(partitionment,move_01);
    uVar1 = *ptVar4 + local_a0;
    local_a0 = uVar1;
    if ((int)(uint)best_partitionment.partitionment_.super__Bvector_base<std::allocator<bool>_>.
                   _M_impl.super__Bvector_impl_data._M_end_of_storage < (int)uVar1) {
      Partitionment::operator=
                ((Partitionment *)
                 &gain_container.num_cells_in_partitions_.
                  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,partitionment);
      best_partitionment.partitionment_.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_end_of_storage._0_4_ = uVar1;
    }
    local_a4 = local_a4 + 1;
  }
  Partitionment::operator=
            (partitionment,
             (Partitionment *)
             &gain_container.num_cells_in_partitions_.
              super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  GainContainer::~GainContainer((GainContainer *)local_90);
  Partitionment::~Partitionment
            ((Partitionment *)
             &gain_container.num_cells_in_partitions_.
              super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return (uint)best_partitionment.partitionment_.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_end_of_storage;
}

Assistant:

unsigned FM_pass(const Hypergraph &hypergraph, Partitionment &partitionment, unsigned max_diff) {
  unsigned best_cost_reduction = 0;
  Partitionment best_partitionment(partitionment);
  GainContainer gain_container(hypergraph, partitionment);
  int cur_cost_reduction = 0;
  for (unsigned i = 0; i < hypergraph.getCells().size(); ++i) {
    auto [move, gain] = gain_container.getBestMove(max_diff);
    gain_container.update(hypergraph, partitionment, move);
    partitionment.doMove(move);
    cur_cost_reduction += gain;
    if (cur_cost_reduction > (int)best_cost_reduction) {
      best_cost_reduction = (unsigned)cur_cost_reduction;
      best_partitionment = partitionment;
    }
  }
  partitionment = std::move(best_partitionment);
  return best_cost_reduction;
}